

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O3

void do_leader(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  CHAR_DATA *ch_00;
  char *__format;
  char *pcVar2;
  char buf [4608];
  char arg1 [4608];
  char acStack_2418 [4608];
  char local_1218 [4608];
  
  if ((0x35 < ch->level) && (bVar1 = is_npc(ch), !bVar1)) {
    one_argument(argument,local_1218);
    if (local_1218[0] == '\0') {
      pcVar2 = "Syntax: leader <char>\n\r";
    }
    else {
      ch_00 = get_char_world(ch,local_1218);
      if (ch_00 == (CHAR_DATA *)0x0) {
        pcVar2 = "They aren\'t playing.\n\r";
      }
      else {
        bVar1 = is_npc(ch_00);
        if (!bVar1) {
          if (ch_00->pcdata->induct == 5) {
            send_to_char("Your power to induct has been taken away!\n\r",ch_00);
            sprintf(acStack_2418,"You have taken away %s\'s power to induct.\n\r",ch_00->name);
            send_to_char(acStack_2418,ch);
            ch_00->pcdata->induct = 0;
            pcVar2 = ch->true_name;
            __format = "AUTO: %s removed leadership.\n\r";
          }
          else {
            send_to_char("You have been given the power to induct!\n\r",ch_00);
            sprintf(acStack_2418,"You have given %s the power to induct.\n\r",ch_00->name);
            send_to_char(acStack_2418,ch);
            ch_00->pcdata->induct = 5;
            update_cskills(ch_00);
            pcVar2 = ch->true_name;
            __format = "AUTO: %s gave leadership.\n\r";
          }
          sprintf(acStack_2418,__format,pcVar2);
          add_history((CHAR_DATA *)0x0,ch_00,acStack_2418);
          return;
        }
        pcVar2 = "Can\'t make mobs leaders.\n\r";
      }
    }
    send_to_char(pcVar2,ch);
    return;
  }
  send_to_char("Huh?\n\r",ch);
  return;
}

Assistant:

void do_leader(CHAR_DATA *ch, char *argument)
{
	char arg1[MAX_INPUT_LENGTH];
	char buf[MAX_STRING_LENGTH];
	CHAR_DATA *victim;
	int cres = 0;

	if (ch->level < 54 || is_npc(ch))
	{
		send_to_char("Huh?\n\r", ch);
		return;
	}

	argument = one_argument(argument, arg1);

	if (arg1[0] == '\0')
	{
		send_to_char("Syntax: leader <char>\n\r", ch);
		return;
	}

	victim = get_char_world(ch, arg1);

	if (victim == nullptr)
	{
		send_to_char("They aren't playing.\n\r", ch);
		return;
	}

	if (is_npc(victim))
	{
		send_to_char("Can't make mobs leaders.\n\r", ch);
		return;
	}

	if (victim->pcdata->induct == CABAL_LEADER)
	{
		send_to_char("Your power to induct has been taken away!\n\r", victim);

		sprintf(buf, "You have taken away %s's power to induct.\n\r", victim->name);
		send_to_char(buf, ch);

		victim->pcdata->induct = 0;

		sprintf(buf, "AUTO: %s removed leadership.\n\r", ch->true_name);
		add_history(nullptr, victim, buf);
		return;
	}
	else
	{
		send_to_char("You have been given the power to induct!\n\r", victim);

		sprintf(buf, "You have given %s the power to induct.\n\r", victim->name);
		send_to_char(buf, ch);

		victim->pcdata->induct = CABAL_LEADER;
		update_cskills(victim);

		sprintf(buf, "AUTO: %s gave leadership.\n\r", ch->true_name);
		add_history(nullptr, victim, buf);
		return;
	}

	RS.SQL.Update("players SET induct=%d WHERE name = '%s'", ch->pcdata->induct, ch->true_name);
}